

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  Matrix<float,_2,_3> *pMVar3;
  undefined4 *puVar4;
  Matrix<float,_2,_3> *pMVar5;
  Matrix<float,_2,_3> *mat;
  bool bVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Type in0;
  float afStack_a8 [6];
  float local_90 [6];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  int local_60 [6];
  Matrix<float,_2,_3> local_48;
  Matrix<float,_2,_3> local_30;
  
  puVar1 = &local_78;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pMVar3 = (Matrix<float,_2,_3> *)0x0;
    do {
      pMVar5 = (Matrix<float,_2,_3> *)0x0;
      do {
        uVar7 = 0x3f800000;
        if (pMVar3 != pMVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)(puVar1 + (long)pMVar5) = uVar7;
        pMVar5 = (Matrix<float,_2,_3> *)((long)(pMVar5->m_data).m_data[0].m_data + 1);
      } while (pMVar5 != (Matrix<float,_2,_3> *)0x3);
      pMVar5 = (Matrix<float,_2,_3> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar6 = pMVar3 == (Matrix<float,_2,_3> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
    local_78 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_70 = *(undefined8 *)evalCtx->in[1].m_data;
    local_68 = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    puVar4 = &s_constInMat3x2;
    pMVar3 = (Matrix<float,_2,_3> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar2) = puVar4[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      pMVar5 = (Matrix<float,_2,_3> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
      bVar6 = pMVar3 == (Matrix<float,_2,_3> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
  }
  decrement<float,2,3>(&local_30,(MatrixCaseUtils *)&local_78,pMVar5);
  local_90[3] = local_30.m_data.m_data[0].m_data[0] + local_30.m_data.m_data[0].m_data[1];
  local_90[4] = local_30.m_data.m_data[1].m_data[0] + local_30.m_data.m_data[1].m_data[1];
  local_90[5] = local_30.m_data.m_data[2].m_data[0] + local_30.m_data.m_data[2].m_data[1];
  decrement<float,2,3>(&local_48,(MatrixCaseUtils *)&local_78,mat);
  local_90[0] = local_48.m_data.m_data[0].m_data[0] + local_48.m_data.m_data[0].m_data[1];
  local_90[1] = local_48.m_data.m_data[1].m_data[0] + local_48.m_data.m_data[1].m_data[1];
  local_90[2] = local_48.m_data.m_data[2].m_data[0] + local_48.m_data.m_data[2].m_data[1];
  afStack_a8[2] = 0.0;
  afStack_a8[3] = 0.0;
  afStack_a8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_a8[lVar2 + 2] = local_90[lVar2 + 3] + local_90[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_60[2] = 0;
  local_60[3] = 1;
  local_60[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_60[lVar2]] = afStack_a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}